

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

reference __thiscall
nlohmann::
basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
::operator[]<char_const>
          (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
           *this,char *key)

{
  bool bVar1;
  mapped_type *pmVar2;
  undefined8 uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  char *in_RSI;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *in_RDI;
  allocator *__lhs;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *in_stack_ffffffffffffff40;
  undefined6 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6e;
  allocator in_stack_ffffffffffffff6f;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>_>
  *in_stack_ffffffffffffff70;
  value_t in_stack_ffffffffffffff7f;
  json_value *in_stack_ffffffffffffff80;
  string *in_stack_ffffffffffffffc0;
  string local_38 [4];
  int in_stack_ffffffffffffffcc;
  json_value local_18;
  
  bVar1 = basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::is_null(in_RDI);
  if (bVar1) {
    in_RDI->m_type = object;
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::json_value::json_value(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7f);
    in_RDI->m_value = local_18;
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::assert_invariant(in_stack_ffffffffffffff40);
  }
  bVar1 = basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::is_object(in_RDI);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,in_RSI,(allocator *)&stack0xffffffffffffffc7);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>_>
             ::operator[](in_stack_ffffffffffffff70,
                          (key_type *)
                          CONCAT17(in_stack_ffffffffffffff6f,
                                   CONCAT16(in_stack_ffffffffffffff6e,in_stack_ffffffffffffff68)));
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffc7);
    return pmVar2;
  }
  uVar3 = __cxa_allocate_exception(0x20);
  __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::type_name(in_RDI);
  __lhs = (allocator *)&stack0xffffffffffffff6f;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&stack0xffffffffffffff70,(char *)__rhs,__lhs);
  std::operator+((char *)__lhs,__rhs);
  detail::type_error::create(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc0);
  __cxa_throw(uVar3,&detail::type_error::typeinfo,detail::type_error::~type_error);
}

Assistant:

reference operator[](T* key)
    {
        // implicitly convert null to object
        if (is_null())
        {
            m_type = value_t::object;
            m_value = value_t::object;
            assert_invariant();
        }

        // at only works for objects
        if (JSON_LIKELY(is_object()))
        {
            return m_value.object->operator[](key);
        }

        JSON_THROW(type_error::create(305, "cannot use operator[] with " + std::string(type_name())));
    }